

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

errr grab_base_and_int(int *value,char **base,char *name_and_value)

{
  _Bool _Var1;
  int iVar2;
  char *value_name_00;
  char *pcVar3;
  char *value_name;
  char *name_and_value_local;
  char **base_local;
  int *value_local;
  
  value_name_00 = string_make(name_and_value);
  _Var1 = find_value_arg(value_name_00,(char *)0x0,0,value);
  if (_Var1) {
    iVar2 = strncmp(value_name_00,"SLAY_",5);
    if (iVar2 == 0) {
      pcVar3 = string_make(value_name_00 + 5);
      *base = pcVar3;
      string_free(value_name_00);
      value_local._4_4_ = 0;
    }
    else {
      string_free(value_name_00);
      value_local._4_4_ = 0x1e;
    }
  }
  else {
    string_free(value_name_00);
    value_local._4_4_ = 0x1e;
  }
  return value_local._4_4_;
}

Assistant:

errr grab_base_and_int(int *value, char **base, const char *name_and_value)
{
	/* Get a rewritable string */
	char *value_name = string_make(name_and_value);

	/* Parse the value expression */
	if (!find_value_arg(value_name, NULL, 0, value)) {
		string_free(value_name);
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Must be a slay */
	if (strncmp(value_name, "SLAY_", 5)) {
		string_free(value_name);
		return PARSE_ERROR_INVALID_VALUE;
	}
	*base = string_make(value_name + 5);
	string_free(value_name);

	/* If we've got this far, assume it's a valid monster base name */
	return PARSE_ERROR_NONE;
}